

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectdata * cpool_get_live_conn(cpool *cpool)

{
  Curl_hash_element *pCVar1;
  Curl_llist_node *n;
  connectdata *pcVar2;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_28;
  
  Curl_hash_start_iterate(&cpool->dest2bundle,&CStack_28);
  pCVar1 = Curl_hash_next_element(&CStack_28);
  while( true ) {
    if (pCVar1 == (Curl_hash_element *)0x0) {
      return (connectdata *)0x0;
    }
    n = Curl_llist_head((Curl_llist *)pCVar1->ptr);
    if (n != (Curl_llist_node *)0x0) break;
    pCVar1 = Curl_hash_next_element(&CStack_28);
  }
  pcVar2 = (connectdata *)Curl_node_elem(n);
  return pcVar2;
}

Assistant:

static struct connectdata *cpool_get_live_conn(struct cpool *cpool)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;
  struct cpool_bundle *bundle;
  struct Curl_llist_node *conn_node;

  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);
  for(he = Curl_hash_next_element(&iter); he;
      he = Curl_hash_next_element(&iter)) {
    bundle = he->ptr;
    conn_node = Curl_llist_head(&bundle->conns);
    if(conn_node)
      return Curl_node_elem(conn_node);
  }
  return NULL;
}